

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode set_ssl_version_min_max(SSL_CTX *ctx,connectdata *conn)

{
  long lVar1;
  long local_58;
  long local_48;
  long local_40;
  long ossl_ssl_version_max;
  long ossl_ssl_version_min;
  long curl_ssl_version_max;
  long curl_ssl_version_min;
  connectdata *conn_local;
  SSL_CTX *ctx_local;
  
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_48 = (conn->proxy_ssl_config).version;
  }
  else {
    local_48 = (conn->ssl_config).version;
  }
  ossl_ssl_version_max = 0;
  if (local_48 - 1U < 6 || local_48 == 7) {
    switch((long)&switchD_0095f633::switchdataD_00c6b354 +
           (long)(int)(&switchD_0095f633::switchdataD_00c6b354)[local_48 - 1U]) {
    case 0x95f635:
      ossl_ssl_version_max = 0x301;
      break;
    case 0x95f63f:
      ossl_ssl_version_max = 0x302;
      break;
    case 0x95f649:
      ossl_ssl_version_max = 0x303;
      break;
    case 0x95f653:
      ossl_ssl_version_max = 0x304;
    }
  }
  if ((local_48 != 0) &&
     (lVar1 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x7b,ossl_ssl_version_max,(void *)0x0), lVar1 == 0)) {
    return CURLE_SSL_CONNECT_ERROR;
  }
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_58 = (conn->proxy_ssl_config).version_max;
  }
  else {
    local_58 = (conn->ssl_config).version_max;
  }
  if ((local_58 != 0) && (local_58 != 0x10000)) {
    if (local_58 == 0x40000) {
      local_40 = 0x301;
      goto LAB_0095f783;
    }
    if (local_58 == 0x50000) {
      local_40 = 0x302;
      goto LAB_0095f783;
    }
    if (local_58 == 0x60000) {
      local_40 = 0x303;
      goto LAB_0095f783;
    }
    if (local_58 == 0x70000) {
      local_40 = 0x304;
      goto LAB_0095f783;
    }
  }
  local_40 = 0;
LAB_0095f783:
  lVar1 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x7c,local_40,(void *)0x0);
  if (lVar1 == 0) {
    ctx_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
  }
  else {
    ctx_local._4_4_ = CURLE_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

static CURLcode
set_ssl_version_min_max(SSL_CTX *ctx, struct connectdata *conn)
{
  /* first, TLS min version... */
  long curl_ssl_version_min = SSL_CONN_CONFIG(version);
  long curl_ssl_version_max;

  /* convert curl min SSL version option to OpenSSL constant */
#if defined(OPENSSL_IS_BORINGSSL) || defined(LIBRESSL_VERSION_NUMBER)
  uint16_t ossl_ssl_version_min = 0;
  uint16_t ossl_ssl_version_max = 0;
#else
  long ossl_ssl_version_min = 0;
  long ossl_ssl_version_max = 0;
#endif
  switch(curl_ssl_version_min) {
    case CURL_SSLVERSION_TLSv1: /* TLS 1.x */
    case CURL_SSLVERSION_TLSv1_0:
      ossl_ssl_version_min = TLS1_VERSION;
      break;
    case CURL_SSLVERSION_TLSv1_1:
      ossl_ssl_version_min = TLS1_1_VERSION;
      break;
    case CURL_SSLVERSION_TLSv1_2:
      ossl_ssl_version_min = TLS1_2_VERSION;
      break;
    case CURL_SSLVERSION_TLSv1_3:
#ifdef TLS1_3_VERSION
      ossl_ssl_version_min = TLS1_3_VERSION;
      break;
#else
      return CURLE_NOT_BUILT_IN;
#endif
  }

  /* CURL_SSLVERSION_DEFAULT means that no option was selected.
     We don't want to pass 0 to SSL_CTX_set_min_proto_version as
     it would enable all versions down to the lowest supported by
     the library.
     So we skip this, and stay with the library default
  */
  if(curl_ssl_version_min != CURL_SSLVERSION_DEFAULT) {
    if(!SSL_CTX_set_min_proto_version(ctx, ossl_ssl_version_min)) {
      return CURLE_SSL_CONNECT_ERROR;
    }
  }

  /* ... then, TLS max version */
  curl_ssl_version_max = SSL_CONN_CONFIG(version_max);

  /* convert curl max SSL version option to OpenSSL constant */
  switch(curl_ssl_version_max) {
    case CURL_SSLVERSION_MAX_TLSv1_0:
      ossl_ssl_version_max = TLS1_VERSION;
      break;
    case CURL_SSLVERSION_MAX_TLSv1_1:
      ossl_ssl_version_max = TLS1_1_VERSION;
      break;
    case CURL_SSLVERSION_MAX_TLSv1_2:
      ossl_ssl_version_max = TLS1_2_VERSION;
      break;
#ifdef TLS1_3_VERSION
    case CURL_SSLVERSION_MAX_TLSv1_3:
      ossl_ssl_version_max = TLS1_3_VERSION;
      break;
#endif
    case CURL_SSLVERSION_MAX_NONE:  /* none selected */
    case CURL_SSLVERSION_MAX_DEFAULT:  /* max selected */
    default:
      /* SSL_CTX_set_max_proto_version states that:
        setting the maximum to 0 will enable
        protocol versions up to the highest version
        supported by the library */
      ossl_ssl_version_max = 0;
      break;
  }

  if(!SSL_CTX_set_max_proto_version(ctx, ossl_ssl_version_max)) {
    return CURLE_SSL_CONNECT_ERROR;
  }

  return CURLE_OK;
}